

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_compress.c
# Opt level: O0

size_t FSE_compress_wksp(void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,
                        uint tableLog,void *workSpace,size_t wkspSize)

{
  char cVar1;
  uint uVar2;
  ulong uVar3;
  void *pvVar4;
  size_t workSpaceSize;
  void *pvVar5;
  int local_6b4;
  size_t cSize;
  size_t _var_err___1;
  size_t nc_err;
  size_t _var_err__;
  size_t maxCount;
  size_t scratchBufferSize;
  void *scratchBuffer;
  size_t CTableSize;
  FSE_CTable *CTable;
  S16 norm [256];
  uint count [256];
  BYTE *oend;
  BYTE *op;
  BYTE *ostart;
  uint tableLog_local;
  uint maxSymbolValue_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  cVar1 = (char)tableLog;
  uVar3 = (ulong)((1 << (cVar1 - 1U & 0x1f)) + 1 + (maxSymbolValue + 1) * 2);
  pvVar4 = (void *)((long)workSpace + uVar3 * 4);
  workSpaceSize = wkspSize + uVar3 * -4;
  if (tableLog < 0xd) {
    local_6b4 = 0x400;
  }
  else {
    local_6b4 = 1 << (cVar1 - 2U & 0x1f);
  }
  if (wkspSize < (1 << (cVar1 - 1U & 0x1f)) + 1 + (maxSymbolValue + 1) * 2 + local_6b4) {
    dst_local = (void *)0xffffffffffffffd4;
  }
  else if (srcSize < 2) {
    dst_local = (void *)0x0;
  }
  else {
    ostart._4_4_ = maxSymbolValue;
    if (maxSymbolValue == 0) {
      ostart._4_4_ = 0xff;
    }
    ostart._0_4_ = tableLog;
    if (tableLog == 0) {
      ostart._0_4_ = 0xb;
    }
    _tableLog_local = (void *)srcSize;
    srcSize_local = (size_t)src;
    src_local = (void *)dstSize;
    dstSize_local = (size_t)dst;
    pvVar5 = (void *)HIST_count_wksp((uint *)(norm + 0xfc),(uint *)((long)&ostart + 4),src,srcSize,
                                     pvVar4,workSpaceSize);
    uVar2 = ERR_isError((size_t)pvVar5);
    dst_local = pvVar5;
    if (uVar2 == 0) {
      if (pvVar5 == _tableLog_local) {
        dst_local = (void *)0x1;
      }
      else if (pvVar5 == (void *)0x1) {
        dst_local = (void *)0x0;
      }
      else if (pvVar5 < (void *)((ulong)_tableLog_local >> 7)) {
        dst_local = (void *)0x0;
      }
      else {
        ostart._0_4_ = FSE_optimalTableLog((uint)ostart,(size_t)_tableLog_local,ostart._4_4_);
        pvVar5 = (void *)FSE_normalizeCount((short *)&CTable,(uint)ostart,(uint *)(norm + 0xfc),
                                            (size_t)_tableLog_local,ostart._4_4_);
        uVar2 = ERR_isError((size_t)pvVar5);
        dst_local = pvVar5;
        if (uVar2 == 0) {
          pvVar5 = (void *)FSE_writeNCount(dst,dstSize,(short *)&CTable,ostart._4_4_,(uint)ostart);
          uVar2 = ERR_isError((size_t)pvVar5);
          dst_local = pvVar5;
          if (uVar2 == 0) {
            pvVar5 = (void *)((long)pvVar5 + (long)dst);
            pvVar4 = (void *)FSE_buildCTable_wksp
                                       ((FSE_CTable *)workSpace,(short *)&CTable,ostart._4_4_,
                                        (uint)ostart,pvVar4,workSpaceSize);
            uVar2 = ERR_isError((size_t)pvVar4);
            dst_local = pvVar4;
            if (uVar2 == 0) {
              pvVar4 = (void *)FSE_compress_usingCTable
                                         (pvVar5,(long)dst + (dstSize - (long)pvVar5),
                                          (void *)srcSize_local,(size_t)_tableLog_local,
                                          (FSE_CTable *)workSpace);
              uVar2 = ERR_isError((size_t)pvVar4);
              dst_local = pvVar4;
              if (uVar2 == 0) {
                if (pvVar4 == (void *)0x0) {
                  dst_local = (void *)0x0;
                }
                else if ((ulong)(((long)pvVar4 + (long)pvVar5) - (long)dst) <
                         (long)_tableLog_local - 1U) {
                  dst_local = (void *)(((long)pvVar4 + (long)pvVar5) - (long)dst);
                }
                else {
                  dst_local = (void *)0x0;
                }
              }
            }
          }
        }
      }
    }
  }
  return (size_t)dst_local;
}

Assistant:

size_t FSE_compress_wksp (void* dst, size_t dstSize, const void* src, size_t srcSize, unsigned maxSymbolValue, unsigned tableLog, void* workSpace, size_t wkspSize)
{
    BYTE* const ostart = (BYTE*) dst;
    BYTE* op = ostart;
    BYTE* const oend = ostart + dstSize;

    unsigned count[FSE_MAX_SYMBOL_VALUE+1];
    S16   norm[FSE_MAX_SYMBOL_VALUE+1];
    FSE_CTable* CTable = (FSE_CTable*)workSpace;
    size_t const CTableSize = FSE_CTABLE_SIZE_U32(tableLog, maxSymbolValue);
    void* scratchBuffer = (void*)(CTable + CTableSize);
    size_t const scratchBufferSize = wkspSize - (CTableSize * sizeof(FSE_CTable));

    /* init conditions */
    if (wkspSize < FSE_WKSP_SIZE_U32(tableLog, maxSymbolValue)) return ERROR(tableLog_tooLarge);
    if (srcSize <= 1) return 0;  /* Not compressible */
    if (!maxSymbolValue) maxSymbolValue = FSE_MAX_SYMBOL_VALUE;
    if (!tableLog) tableLog = FSE_DEFAULT_TABLELOG;

    /* Scan input and build symbol stats */
    {   CHECK_V_F(maxCount, HIST_count_wksp(count, &maxSymbolValue, src, srcSize, scratchBuffer, scratchBufferSize) );
        if (maxCount == srcSize) return 1;   /* only a single symbol in src : rle */
        if (maxCount == 1) return 0;         /* each symbol present maximum once => not compressible */
        if (maxCount < (srcSize >> 7)) return 0;   /* Heuristic : not compressible enough */
    }

    tableLog = FSE_optimalTableLog(tableLog, srcSize, maxSymbolValue);
    CHECK_F( FSE_normalizeCount(norm, tableLog, count, srcSize, maxSymbolValue) );

    /* Write table description header */
    {   CHECK_V_F(nc_err, FSE_writeNCount(op, oend-op, norm, maxSymbolValue, tableLog) );
        op += nc_err;
    }

    /* Compress */
    CHECK_F( FSE_buildCTable_wksp(CTable, norm, maxSymbolValue, tableLog, scratchBuffer, scratchBufferSize) );
    {   CHECK_V_F(cSize, FSE_compress_usingCTable(op, oend - op, src, srcSize, CTable) );
        if (cSize == 0) return 0;   /* not enough space for compressed data */
        op += cSize;
    }

    /* check compressibility */
    if ( (size_t)(op-ostart) >= srcSize-1 ) return 0;

    return op-ostart;
}